

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

void __thiscall acto::core::runtime_t::~runtime_t(runtime_t *this)

{
  bool bVar1;
  __int_type_conflict _Var2;
  void *__stat_loc;
  runtime_t *this_local;
  
  (this->super_callbacks)._vptr_callbacks = (_func_int **)&PTR__runtime_t_0027fbe0;
  __stat_loc = (void *)0x1;
  std::atomic<bool>::operator=(&this->terminating_,true);
  event::signaled(&this->queue_event_);
  event::wait(&this->no_workers_event_,__stat_loc);
  std::atomic<bool>::operator=(&this->active_,false);
  event::signaled(&this->queue_event_);
  bVar1 = std::thread::joinable(&this->m_scheduler);
  if (bVar1) {
    std::thread::join();
  }
  _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&this->workers_);
  bVar1 = false;
  if (_Var2 == 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base *)&(this->workers_).reserved);
    bVar1 = _Var2 == 0;
  }
  if (bVar1) {
    std::thread::~thread(&this->m_scheduler);
    std::
    unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
    ::~unordered_set(&this->actors_);
    event::~event(&this->no_workers_event_);
    event::~event(&this->idle_workers_event_);
    event::~event(&this->queue_event_);
    event::~event(&this->no_actors_event_);
    worker_t::callbacks::~callbacks(&this->super_callbacks);
    return;
  }
  __assert_fail("workers_.count == 0 && workers_.reserved == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                ,0x6a,"virtual acto::core::runtime_t::~runtime_t()");
}

Assistant:

runtime_t::~runtime_t() {
  terminating_ = true;
  // Дождаться, когда все потоки будут удалены
  queue_event_.signaled();
  no_workers_event_.wait();

  active_ = false;

  queue_event_.signaled();
  // Stop scheduler's thread.
  if (m_scheduler.joinable()) {
    m_scheduler.join();
  }

  assert(workers_.count == 0 && workers_.reserved == 0);
}